

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O2

void __thiscall optimization::common_expr_del::Env::Env(Env *this,MirFunction *func)

{
  int iVar1;
  long lVar2;
  
  this->func = func;
  if ((func->variables)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    iVar1 = 0xffff;
  }
  else {
    lVar2 = std::_Rb_tree_decrement(&(func->variables)._M_t._M_impl.super__Rb_tree_header._M_header)
    ;
    iVar1 = *(int *)(lVar2 + 0x20);
  }
  this->varId = iVar1;
  return;
}

Assistant:

Env(mir::inst::MirFunction& func) : func(func) {
    if (func.variables.size()) {
      auto end_iter = func.variables.end();
      end_iter--;
      varId = end_iter->first;
    } else {
      varId = mir::inst::VarId(65535);
    }
  }